

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_time.c
# Opt level: O0

unsigned_long ion_time(void)

{
  clock_t cVar1;
  ulong uVar2;
  double dVar3;
  
  cVar1 = clock();
  dVar3 = ((double)cVar1 / 1000000.0) * 1000.0;
  uVar2 = (ulong)dVar3;
  return uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
}

Assistant:

unsigned long
ion_time(
) {
#if defined(ARDUINO)
	return (unsigned long) (millis());

#elif defined(WIN32) || defined(_WIN32) || defined(__WIN32)
	return (unsigned long) (((double) clock() / CLOCKS_PER_SEC) * 1000);

#elif defined (__unix__) || defined(__APPLE__) && defined (__MACH__)
	return (unsigned long) (((double) clock() / CLOCKS_PER_SEC) * 1000);

#elif defined (__MACH__) && defined(__APPLE__)
	return (unsigned long) (((double) AbsoluteToNanoseconds((mach_absolute_time()))) * 1000000);

#elif defined(__CYGWIN)

	struct timeval time;

	gettimeofday(&time, NULL);
	return (unsigned long) (time.tv_sec * 1000);

#endif
}